

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O0

void __thiscall TPZIntCube3D::Point(TPZIntCube3D *this,int ip,TPZVec<double> *pos,REAL *w)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  ostream *poVar4;
  void *this_00;
  double *in_RCX;
  TPZVec<double> *in_RDX;
  int in_ESI;
  long *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  int iz;
  int ie;
  int ik;
  int in_stack_ffffffffffffff64;
  
  if ((((in_RDI[5] != 0) && (in_RDI[4] != 0)) && (in_RDI[3] != 0)) &&
     ((-1 < in_ESI && (iVar1 = (**(code **)(*in_RDI + 0x18))(), in_ESI < iVar1)))) {
    TPZGaussRule::NInt((TPZGaussRule *)in_RDI[3]);
    iVar1 = TPZGaussRule::NInt((TPZGaussRule *)in_RDI[3]);
    TPZGaussRule::NInt((TPZGaussRule *)in_RDI[4]);
    TPZGaussRule::NInt((TPZGaussRule *)in_RDI[3]);
    TPZGaussRule::NInt((TPZGaussRule *)in_RDI[3]);
    TPZGaussRule::NInt((TPZGaussRule *)in_RDI[4]);
    TPZGaussRule::Loc((TPZGaussRule *)CONCAT44(iVar1,in_ESI),in_stack_ffffffffffffff64);
    pdVar3 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar3 = (double)in_ST0;
    TPZGaussRule::Loc((TPZGaussRule *)CONCAT44(iVar1,in_ESI),in_stack_ffffffffffffff64);
    pdVar3 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar3 = (double)in_ST1;
    TPZGaussRule::Loc((TPZGaussRule *)CONCAT44(iVar1,in_ESI),in_stack_ffffffffffffff64);
    pdVar3 = TPZVec<double>::operator[](in_RDX,2);
    *pdVar3 = (double)in_ST2;
    TPZGaussRule::W((TPZGaussRule *)CONCAT44(iVar1,in_ESI),in_stack_ffffffffffffff64);
    TPZGaussRule::W((TPZGaussRule *)CONCAT44(iVar1,in_ESI),in_stack_ffffffffffffff64);
    TPZGaussRule::W((TPZGaussRule *)CONCAT44(iVar1,in_ESI),in_stack_ffffffffffffff64);
    *in_RCX = (double)(in_ST3 * in_ST4 * in_ST5);
    return;
  }
  if (((in_RDI[3] == 0) || (in_RDI[4] == 0)) || (in_RDI[5] == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Null Pointer passed to method ");
    std::operator<<(poVar4,"TPZIntCube3D::Point(..)\n");
  }
  if ((-1 < in_ESI) && (iVar1 = in_ESI, iVar2 = (**(code **)(*in_RDI + 0x18))(), iVar1 < iVar2)) {
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"ip = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
  poVar4 = std::operator<<(poVar4,", Out of Range: 0 -> ");
  iVar1 = (**(code **)(*in_RDI + 0x18))();
  this_00 = (void *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZIntCube3D::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
	if((fIntZeta) && (fIntEta) && (fIntKsi) && ((ip >= 0) && (ip < NPoints()))){
		int ik, ie , iz;
		ik = ip % fIntKsi->NInt();
		ie = (ip % (fIntKsi->NInt()*fIntEta->NInt()))/fIntKsi->NInt();
		iz = ip/(fIntKsi->NInt()*fIntEta->NInt());
		
		pos[0] 	= fIntKsi->Loc(ik);
		pos[1]	= fIntEta->Loc(ie);
		pos[2]	= fIntZeta->Loc(iz);
		w       = fIntKsi->W(ik)*fIntEta->W(ie)*fIntZeta->W(iz);
		return;
	}
	if(!fIntKsi || !fIntEta || !fIntZeta)
		PZError << "Null Pointer passed to method " << "TPZIntCube3D::Point(..)\n";
	if((ip < 0) || (ip >= NPoints()))
		PZError 	<< "ip = " << ip << ", Out of Range: 0 -> " << NPoints() << std::endl;
}